

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcoefct.c
# Opt level: O3

void start_output_pass(j_decompress_ptr cinfo)

{
  int iVar1;
  jpeg_d_coef_controller *pjVar2;
  JQUANT_TBL *pJVar3;
  int (*paiVar4) [64];
  bool bVar5;
  _func_int_j_decompress_ptr_JSAMPIMAGE *p_Var6;
  code *pcVar7;
  jpeg_component_info *pjVar8;
  _func_int_j_decompress_ptr_JSAMPIMAGE *p_Var9;
  undefined4 uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  my_coef_ptr_conflict1 coef;
  long lVar14;
  
  pjVar2 = cinfo->coef;
  if (pjVar2->coef_arrays == (jvirt_barray_ptr *)0x0) goto LAB_0011db01;
  if (((cinfo->do_block_smoothing == 0) || (cinfo->progressive_mode == 0)) ||
     (cinfo->coef_bits == (int (*) [64])0x0)) {
LAB_0011daf6:
    pcVar7 = decompress_data;
  }
  else {
    p_Var6 = pjVar2[5].decompress_data;
    if (p_Var6 == (_func_int_j_decompress_ptr_JSAMPIMAGE *)0x0) {
      p_Var6 = (_func_int_j_decompress_ptr_JSAMPIMAGE *)
               (*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,(long)cinfo->num_components * 0x50);
      pjVar2[5].decompress_data = p_Var6;
    }
    uVar13 = (ulong)(uint)cinfo->num_components;
    if (cinfo->num_components < 1) goto LAB_0011daf6;
    pjVar8 = cinfo->comp_info;
    p_Var9 = p_Var6 + uVar13 * 0x28;
    lVar11 = 0;
    lVar12 = 4;
    bVar5 = false;
    do {
      pJVar3 = pjVar8->quant_table;
      if (((((pJVar3 == (JQUANT_TBL *)0x0) || (pJVar3->quantval[0] == 0)) ||
           ((pJVar3->quantval[1] == 0 ||
            ((pJVar3->quantval[8] == 0 || (pJVar3->quantval[0x10] == 0)))))) ||
          (pJVar3->quantval[9] == 0)) ||
         ((((pJVar3->quantval[2] == 0 || (pJVar3->quantval[3] == 0)) || (pJVar3->quantval[10] == 0))
          || ((pJVar3->quantval[0x11] == 0 || (pJVar3->quantval[0x18] == 0)))))) goto LAB_0011daf6;
      paiVar4 = cinfo->coef_bits;
      if (paiVar4[lVar11][0] < 0) goto LAB_0011daf6;
      *(int *)p_Var6 = paiVar4[lVar11][0];
      lVar14 = 0;
      do {
        uVar10 = 0xffffffff;
        if (1 < cinfo->input_scan_number) {
          uVar10 = *(undefined4 *)((long)paiVar4[(int)uVar13 + (int)lVar11] + lVar14 + 4);
        }
        *(undefined4 *)(p_Var9 + lVar14 + 4) = uVar10;
        iVar1 = *(int *)((long)*paiVar4 + lVar14 + lVar12);
        *(int *)(p_Var6 + lVar14 + 4) = iVar1;
        if (iVar1 != 0) {
          bVar5 = true;
        }
        lVar14 = lVar14 + 4;
      } while (lVar14 != 0x24);
      p_Var6 = p_Var6 + 0x28;
      p_Var9 = p_Var9 + 0x28;
      lVar11 = lVar11 + 1;
      pjVar8 = pjVar8 + 1;
      uVar13 = (ulong)cinfo->num_components;
      lVar12 = lVar12 + 0x100;
    } while (lVar11 < (long)uVar13);
    if (!bVar5) goto LAB_0011daf6;
    pcVar7 = decompress_smooth_data;
  }
  pjVar2->decompress_data = pcVar7;
LAB_0011db01:
  cinfo->output_iMCU_row = 0;
  return;
}

Assistant:

METHODDEF(void)
start_output_pass(j_decompress_ptr cinfo)
{
#ifdef BLOCK_SMOOTHING_SUPPORTED
  my_coef_ptr coef = (my_coef_ptr)cinfo->coef;

  /* If multipass, check to see whether to use block smoothing on this pass */
  if (coef->pub.coef_arrays != NULL) {
    if (cinfo->do_block_smoothing && smoothing_ok(cinfo))
      coef->pub.decompress_data = decompress_smooth_data;
    else
      coef->pub.decompress_data = decompress_data;
  }
#endif
  cinfo->output_iMCU_row = 0;
}